

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::baggage::Baggage_restrictionManagerTest_Test::TestBody
          (Baggage_restrictionManagerTest_Test *this)

{
  char cVar1;
  SpanContext *pSVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  AssertionResult gtest_ar_1;
  undefined1 local_3a8 [16];
  __alloc_node_gen_t __alloc_node_gen;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Prime_rehash_policy local_378;
  __node_base_ptr local_368;
  string local_360;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  metrics;
  BaggageSetter setter;
  shared_ptr<const_jaegertracing::Tracer> local_328;
  TestRestrictionManager manager;
  string local_308;
  string local_2e8;
  string local_2c8;
  vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> local_2a8;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_288;
  TraceID local_268;
  time_point local_258;
  time_point local_250;
  StrMap baggage;
  _Alloc_hider local_1e0;
  char local_1d0 [56];
  Span span;
  
  manager.super_RestrictionManager._vptr_RestrictionManager =
       (RestrictionManager)&PTR__TestRestrictionManager_0020ecf8;
  jaegertracing::metrics::Metrics::makeNullMetrics();
  setter._restrictionManager = &manager.super_RestrictionManager;
  setter._metrics =
       (Metrics *)
       metrics._M_t.
       super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
       ._M_t.
       super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
       .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl;
  local_328.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_328.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_268._high = 0;
  local_268._low = 0;
  __alloc_node_gen._M_h = (__hashtable_alloc *)&local_368;
  local_388._M_allocated_capacity = 0;
  local_388._8_8_ = 0;
  sStack_390.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_378._M_max_load_factor = 1.0;
  local_378._4_4_ = 0;
  local_378._M_next_resize = 0;
  local_368 = (__node_base_ptr)0x0;
  gtest_ar_1._0_8_ = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_1,"");
  SpanContext::SpanContext
            ((SpanContext *)&baggage,&local_268,0x7b,0x1c8,'\x01',(StrMap *)&__alloc_node_gen,
             (string *)&gtest_ar_1);
  pcVar4 = "";
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"","");
  local_250.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_258.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_288.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Span::Span(&span,&local_328,(SpanContext *)&baggage,&local_360,&local_250,&local_258,&local_288,
             &local_2a8);
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::~vector
            (&local_2a8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  baggage._M_h._M_buckets = (__buckets_ptr)&PTR__SpanContext_0020d2a0;
  if (local_1e0._M_p != local_1d0) {
    operator_delete(local_1e0._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&baggage._M_h._M_single_bucket);
  if ((undefined1 *)gtest_ar_1._0_8_ != local_3a8) {
    operator_delete((void *)gtest_ar_1._0_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&__alloc_node_gen);
  if (local_328.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pSVar2 = Span::context(&span);
  baggage._M_h._M_buckets = (__buckets_ptr)0x0;
  baggage._M_h._M_bucket_count = (pSVar2->_baggage)._M_h._M_bucket_count;
  baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  baggage._M_h._M_element_count = (pSVar2->_baggage)._M_h._M_element_count;
  baggage._M_h._M_rehash_policy._M_max_load_factor =
       (pSVar2->_baggage)._M_h._M_rehash_policy._M_max_load_factor;
  baggage._M_h._M_rehash_policy._4_4_ =
       *(undefined4 *)&(pSVar2->_baggage)._M_h._M_rehash_policy.field_0x4;
  baggage._M_h._M_rehash_policy._M_next_resize =
       (pSVar2->_baggage)._M_h._M_rehash_policy._M_next_resize;
  baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __alloc_node_gen._M_h = (__hashtable_alloc *)&baggage;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&baggage,&(pSVar2->_baggage)._M_h,&__alloc_node_gen);
  __alloc_node_gen._M_h = (__hashtable_alloc *)&local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__alloc_node_gen,"abc","");
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"123","");
  BaggageSetter::
  setBaggage<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
            (&setter,&span,&baggage,(string *)&__alloc_node_gen,&local_2c8,
             (anonymous_namespace)::
             log<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__alloc_node_gen._M_h != &local_388) {
    operator_delete(__alloc_node_gen._M_h);
  }
  local_360._M_dataplus._M_p._0_4_ = 1;
  gtest_ar_1._0_8_ = baggage._M_h._M_element_count;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&__alloc_node_gen,"1","baggage.size()",(int *)&local_360,
             (unsigned_long *)&gtest_ar_1);
  if ((char)__alloc_node_gen._M_h == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (sStack_390.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((sStack_390.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_360,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
               ,0x73,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_360,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_360);
    if (gtest_ar_1._0_8_ != 0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (gtest_ar_1._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    __alloc_node_gen._M_h = (__hashtable_alloc *)&local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__alloc_node_gen,"abc","");
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&baggage,(key_type *)&__alloc_node_gen);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"123\"","baggage[\"abc\"]",(char (*) [4])0x1df5b2,pmVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__alloc_node_gen._M_h != &local_388) {
      operator_delete(__alloc_node_gen._M_h);
    }
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&__alloc_node_gen);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_360,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
                 ,0x74,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_360,(Message *)&__alloc_node_gen);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_360);
      if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
        cVar1 = testing::internal::IsTrue(true);
        if ((cVar1 != '\0') && (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0)) {
          (**(code **)(*(long *)__alloc_node_gen._M_h + 8))();
        }
        __alloc_node_gen._M_h = (__hashtable_alloc *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_1.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_1.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      __alloc_node_gen._M_h = (__hashtable_alloc *)&local_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__alloc_node_gen,"bcd","");
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"234","");
      BaggageSetter::
      setBaggage<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
                (&setter,&span,&baggage,(string *)&__alloc_node_gen,&local_2e8,
                 (anonymous_namespace)::
                 log<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__alloc_node_gen._M_h != &local_388) {
        operator_delete(__alloc_node_gen._M_h);
      }
      local_360._M_dataplus._M_p._0_4_ = 1;
      gtest_ar_1._0_8_ = baggage._M_h._M_element_count;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&__alloc_node_gen,"1","baggage.size()",(int *)&local_360,
                 (unsigned_long *)&gtest_ar_1);
      if ((char)__alloc_node_gen._M_h == '\0') {
        testing::Message::Message((Message *)&gtest_ar_1);
        if (sStack_390.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((sStack_390.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_360,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
                   ,0x76,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_360,(Message *)&gtest_ar_1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_360);
        if (gtest_ar_1._0_8_ != 0) {
          cVar1 = testing::internal::IsTrue(true);
          if ((cVar1 != '\0') && (gtest_ar_1._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
          }
          gtest_ar_1.success_ = false;
          gtest_ar_1._1_7_ = 0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&sStack_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               );
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&sStack_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               );
        __alloc_node_gen._M_h = (__hashtable_alloc *)&local_388;
        std::__cxx11::string::_M_construct<char_const*>((string *)&__alloc_node_gen,"abc","");
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"1234567890","");
        BaggageSetter::
        setBaggage<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
                  (&setter,&span,&baggage,(string *)&__alloc_node_gen,&local_308,
                   (anonymous_namespace)::
                   log<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__alloc_node_gen._M_h != &local_388) {
          operator_delete(__alloc_node_gen._M_h);
        }
        __alloc_node_gen._M_h = (__hashtable_alloc *)&local_388;
        std::__cxx11::string::_M_construct<char_const*>((string *)&__alloc_node_gen,"abc","");
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&baggage,(key_type *)&__alloc_node_gen);
        testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
                  ((internal *)&gtest_ar_1,"\"12345678\"","baggage[\"abc\"]",
                   (char (*) [9])"12345678",pmVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__alloc_node_gen._M_h != &local_388) {
          operator_delete(__alloc_node_gen._M_h);
        }
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)&__alloc_node_gen);
          if (gtest_ar_1.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_360,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
                     ,0x78,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_360,(Message *)&__alloc_node_gen);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_360);
          if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
            cVar1 = testing::internal::IsTrue(true);
            if ((cVar1 != '\0') && (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0)) {
              (**(code **)(*(long *)__alloc_node_gen._M_h + 8))();
            }
            __alloc_node_gen._M_h = (__hashtable_alloc *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_1.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&baggage._M_h);
  Span::~Span(&span);
  if ((__uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
       )metrics._M_t.
        super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
        ._M_t.
        super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
        .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
       )0x0) {
    jaegertracing::metrics::Metrics::~Metrics
              ((Metrics *)
               metrics._M_t.
               super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
               ._M_t.
               super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
               .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl);
    operator_delete((void *)metrics._M_t.
                            super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
                            .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>.
                            _M_head_impl);
  }
  return;
}

Assistant:

~TestRestrictionManager() { close(); }